

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

mode_set * __thiscall
ev3dev::dc_motor::commands_abi_cxx11_(mode_set *__return_storage_ptr__,dc_motor *this)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"commands",&local_39);
  device::get_attr_set(__return_storage_ptr__,&this->super_device,&local_38,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

mode_set commands() const { return get_attr_set("commands"); }